

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Sigmoid_x86_avx::forward_inplace(Sigmoid_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  undefined1 (*pauVar10) [32];
  ulong uVar11;
  float fVar12;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar34;
  float fVar35;
  undefined1 auVar13 [16];
  float fVar37;
  float fVar39;
  float fVar40;
  undefined1 auVar21 [32];
  float fVar36;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar38 [16];
  undefined1 extraout_var [60];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 local_108 [16];
  float local_b8;
  undefined1 auVar26 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 auVar46 [32];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar9 = 0;
    auVar56 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar13._8_8_ = 0x8000000000000000;
    auVar13._0_8_ = 0x8000000000000000;
    do {
      auVar42._8_4_ = 0x3c088908;
      auVar42._0_8_ = 0x3c0889083c088908;
      auVar51._8_4_ = 0xc2b0c0a5;
      auVar51._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar41._8_4_ = 0x42b0c0a5;
      auVar41._0_8_ = 0x42b0c0a542b0c0a5;
      auVar42._12_4_ = 0x3c088908;
      auVar51._12_4_ = 0xc2b0c0a5;
      auVar41._12_4_ = 0x42b0c0a5;
      auVar51._16_4_ = 0xc2b0c0a5;
      auVar46._16_4_ = 0x42b0c0a5;
      auVar46._0_16_ = auVar41;
      auVar51._20_4_ = 0xc2b0c0a5;
      auVar46._20_4_ = 0x42b0c0a5;
      auVar51._24_4_ = 0xc2b0c0a5;
      auVar46._24_4_ = 0x42b0c0a5;
      auVar51._28_4_ = 0xc2b0c0a5;
      auVar46._28_4_ = 0x42b0c0a5;
      pauVar10 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar9 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar8 < 8) {
        uVar5 = 0;
        auVar41 = auVar42;
      }
      else {
        iVar4 = 7;
        auVar52._8_4_ = 0x3f800000;
        auVar52._0_8_ = 0x3f8000003f800000;
        auVar52._12_4_ = 0x3f800000;
        do {
          auVar21._0_8_ = *(ulong *)*pauVar10 ^ 0x8000000080000000;
          auVar21._8_4_ = *(uint *)((long)*pauVar10 + 8) ^ 0x80000000;
          auVar21._12_4_ = *(uint *)((long)*pauVar10 + 0xc) ^ 0x80000000;
          auVar21._16_4_ = *(uint *)((long)*pauVar10 + 0x10) ^ 0x80000000;
          auVar21._20_4_ = *(uint *)((long)*pauVar10 + 0x14) ^ 0x80000000;
          auVar21._24_4_ = *(uint *)((long)*pauVar10 + 0x18) ^ 0x80000000;
          auVar21._28_4_ = *(uint *)((long)*pauVar10 + 0x1c) ^ 0x80000000;
          auVar21 = vminps_avx(auVar21,auVar46);
          auVar2 = vmaxps_avx(auVar21,auVar51);
          auVar47._0_4_ = auVar2._0_4_ * 1.442695 + 0.5;
          auVar47._4_4_ = auVar2._4_4_ * 1.442695 + 0.5;
          auVar47._8_4_ = auVar2._8_4_ * 1.442695 + 0.5;
          auVar47._12_4_ = auVar2._12_4_ * 1.442695 + 0.5;
          auVar47._16_4_ = auVar2._16_4_ * 1.442695 + 0.5;
          auVar47._20_4_ = auVar2._20_4_ * 1.442695 + 0.5;
          auVar47._24_4_ = auVar2._24_4_ * 1.442695 + 0.5;
          auVar47._28_4_ = 0x42b1c0a5;
          auVar23 = vroundps_avx(auVar47,1);
          auVar21 = vcmpps_avx(auVar47,auVar23,1);
          auVar21 = vandps_avx(auVar56._0_32_,auVar21);
          auVar21 = vsubps_avx(auVar23,auVar21);
          fVar12 = auVar2._0_4_ + auVar21._0_4_ * -0.6931472;
          fVar34 = auVar2._4_4_ + auVar21._4_4_ * -0.6931472;
          fVar35 = auVar2._8_4_ + auVar21._8_4_ * -0.6931472;
          fVar36 = auVar2._12_4_ + auVar21._12_4_ * -0.6931472;
          fVar37 = auVar2._16_4_ + auVar21._16_4_ * -0.6931472;
          fVar39 = auVar2._20_4_ + auVar21._20_4_ * -0.6931472;
          fVar40 = auVar2._24_4_ + auVar21._24_4_ * -0.6931472;
          auVar49._0_4_ = (int)auVar21._0_4_;
          auVar49._4_4_ = (int)auVar21._4_4_;
          auVar49._8_4_ = (int)auVar21._8_4_;
          auVar49._12_4_ = (int)auVar21._12_4_;
          auVar48._16_4_ = (int)auVar21._16_4_;
          auVar48._0_16_ = auVar49;
          auVar48._20_4_ = (int)auVar21._20_4_;
          auVar48._24_4_ = (int)auVar21._24_4_;
          auVar48._28_4_ = (int)auVar21._28_4_;
          auVar49 = vpslld_avx(auVar49,0x17);
          auVar42 = vpslld_avx(auVar48._16_16_,0x17);
          auVar42 = vpaddd_avx(auVar42,auVar52);
          auVar49 = vpaddd_avx(auVar49,auVar52);
          auVar22._0_4_ =
               auVar56._0_4_ +
               (auVar56._0_4_ + fVar12 +
               fVar12 * fVar12 *
               (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
                 0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5)) * auVar49._0_4_;
          auVar22._4_4_ =
               auVar56._4_4_ +
               (auVar56._4_4_ + fVar34 +
               fVar34 * fVar34 *
               (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
                 0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar49._4_4_;
          auVar22._8_4_ =
               auVar56._8_4_ +
               (auVar56._8_4_ + fVar35 +
               fVar35 * fVar35 *
               (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
                 0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar49._8_4_;
          auVar22._12_4_ =
               auVar56._12_4_ +
               (auVar56._12_4_ + fVar36 +
               fVar36 * fVar36 *
               (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
                 0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar49._12_4_;
          auVar22._16_4_ =
               auVar56._16_4_ +
               (auVar56._16_4_ + fVar37 +
               fVar37 * fVar37 *
               (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
                 0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar42._0_4_;
          auVar22._20_4_ =
               auVar56._20_4_ +
               (auVar56._20_4_ + fVar39 +
               fVar39 * fVar39 *
               (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
                 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar42._4_4_;
          auVar22._24_4_ =
               auVar56._24_4_ +
               (auVar56._24_4_ + fVar40 +
               fVar40 * fVar40 *
               (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                 0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar42._8_4_;
          auVar22._28_4_ =
               auVar56._28_4_ + auVar56._28_4_ + auVar2._28_4_ + auVar23._28_4_ + auVar23._28_4_;
          auVar21 = vrcpps_avx(auVar22);
          fVar12 = auVar21._0_4_;
          fVar34 = auVar21._4_4_;
          auVar2._4_4_ = auVar22._4_4_ * fVar34;
          auVar2._0_4_ = auVar22._0_4_ * fVar12;
          fVar35 = auVar21._8_4_;
          auVar2._8_4_ = auVar22._8_4_ * fVar35;
          fVar36 = auVar21._12_4_;
          auVar2._12_4_ = auVar22._12_4_ * fVar36;
          fVar37 = auVar21._16_4_;
          auVar2._16_4_ = auVar22._16_4_ * fVar37;
          fVar39 = auVar21._20_4_;
          auVar2._20_4_ = auVar22._20_4_ * fVar39;
          fVar40 = auVar21._24_4_;
          auVar2._24_4_ = auVar22._24_4_ * fVar40;
          auVar2._28_4_ = auVar22._28_4_;
          auVar2 = vsubps_avx(auVar56._0_32_,auVar2);
          auVar23._0_4_ = fVar12 + fVar12 * auVar2._0_4_;
          auVar23._4_4_ = fVar34 + fVar34 * auVar2._4_4_;
          auVar23._8_4_ = fVar35 + fVar35 * auVar2._8_4_;
          auVar23._12_4_ = fVar36 + fVar36 * auVar2._12_4_;
          auVar23._16_4_ = fVar37 + fVar37 * auVar2._16_4_;
          auVar23._20_4_ = fVar39 + fVar39 * auVar2._20_4_;
          auVar23._24_4_ = fVar40 + fVar40 * auVar2._24_4_;
          auVar23._28_4_ = auVar21._28_4_ + auVar2._28_4_;
          *pauVar10 = auVar23;
          pauVar10 = pauVar10 + 1;
          iVar4 = iVar4 + 8;
          uVar5 = uVar8 & 0xfffffff8;
        } while (iVar4 < (int)uVar8);
      }
      auVar53._8_4_ = 0x3f800000;
      auVar53._0_8_ = 0x3f8000003f800000;
      auVar53._12_4_ = 0x3f800000;
      auVar54._8_4_ = 0x42b0c0a5;
      auVar54._0_8_ = 0x42b0c0a542b0c0a5;
      auVar54._12_4_ = 0x42b0c0a5;
      auVar38._8_4_ = 0xc2b0c0a5;
      auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar38._12_4_ = 0xc2b0c0a5;
      uVar7 = uVar5 | 3;
      while ((int)uVar7 < (int)uVar8) {
        auVar41 = *(undefined1 (*) [16])*pauVar10;
        auVar14._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
        auVar14._8_4_ = auVar41._8_4_ ^ 0x80000000;
        auVar14._12_4_ = auVar41._12_4_ ^ 0x80000000;
        auVar41 = vminps_avx(auVar14,auVar54);
        auVar52 = vmaxps_avx(auVar38,auVar41);
        auVar43._0_4_ = auVar52._0_4_ * 1.442695 + 0.5;
        auVar43._4_4_ = auVar52._4_4_ * 1.442695 + 0.5;
        auVar43._8_4_ = auVar52._8_4_ * 1.442695 + 0.5;
        auVar43._12_4_ = auVar52._12_4_ * 1.442695 + 0.5;
        auVar50._0_4_ = (int)auVar43._0_4_;
        auVar50._4_4_ = (int)auVar43._4_4_;
        auVar50._8_4_ = (int)auVar43._8_4_;
        auVar50._12_4_ = (int)auVar43._12_4_;
        auVar42 = vcvtdq2ps_avx(auVar50);
        auVar41 = vcmpps_avx(auVar43,auVar42,1);
        auVar41 = vandps_avx(auVar41,auVar53);
        auVar42 = vsubps_avx(auVar42,auVar41);
        fVar12 = auVar52._0_4_ + auVar42._0_4_ * -0.6931472;
        fVar34 = auVar52._4_4_ + auVar42._4_4_ * -0.6931472;
        fVar35 = auVar52._8_4_ + auVar42._8_4_ * -0.6931472;
        fVar36 = auVar52._12_4_ + auVar42._12_4_ * -0.6931472;
        auVar41._8_4_ = 0x3e2aaaaa;
        auVar41._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar41._12_4_ = 0x3e2aaaaa;
        auVar44._0_4_ = (int)auVar42._0_4_;
        auVar44._4_4_ = (int)auVar42._4_4_;
        auVar44._8_4_ = (int)auVar42._8_4_;
        auVar44._12_4_ = (int)auVar42._12_4_;
        auVar42 = vpslld_avx(auVar44,0x17);
        auVar42 = vpaddd_avx(auVar42,auVar53);
        auVar15._0_4_ =
             (fVar12 + 1.0 +
             fVar12 * fVar12 *
             (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
               0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5)) * auVar42._0_4_ + 1.0;
        auVar15._4_4_ =
             (fVar34 + 1.0 +
             fVar34 * fVar34 *
             (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
               0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar42._4_4_ + 1.0;
        auVar15._8_4_ =
             (fVar35 + 1.0 +
             fVar35 * fVar35 *
             (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
               0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar42._8_4_ + 1.0;
        auVar15._12_4_ =
             (fVar36 + 1.0 +
             fVar36 * fVar36 *
             (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
               0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar42._12_4_ + 1.0;
        auVar42 = vrcpps_avx(auVar15);
        fVar12 = auVar42._0_4_;
        auVar16._0_4_ = auVar15._0_4_ * fVar12;
        fVar34 = auVar42._4_4_;
        auVar16._4_4_ = auVar15._4_4_ * fVar34;
        fVar35 = auVar42._8_4_;
        auVar16._8_4_ = auVar15._8_4_ * fVar35;
        fVar36 = auVar42._12_4_;
        auVar16._12_4_ = auVar15._12_4_ * fVar36;
        auVar42 = vsubps_avx(auVar53,auVar16);
        auVar17._0_4_ = fVar12 + fVar12 * auVar42._0_4_;
        auVar17._4_4_ = fVar34 + fVar34 * auVar42._4_4_;
        auVar17._8_4_ = fVar35 + fVar35 * auVar42._8_4_;
        auVar17._12_4_ = fVar36 + fVar36 * auVar42._12_4_;
        *(undefined1 (*) [16])*pauVar10 = auVar17;
        pauVar10 = (undefined1 (*) [32])((long)*pauVar10 + 0x10);
        uVar7 = uVar5 + 7;
        uVar5 = uVar5 + 4;
      }
      auVar41 = vpcmpeqd_avx(auVar41,auVar41);
      if ((int)uVar5 < (int)uVar8) {
        uVar6 = CONCAT44(0,~uVar5 + uVar8);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uVar6;
        auVar49 = vpshufd_avx(auVar18,0x44);
        auVar42 = vorps_avx(auVar49,auVar13);
        auVar52 = vorps_avx(auVar49,auVar13);
        uVar11 = 0;
        auVar46 = _DAT_0054ed20;
        do {
          auVar19._8_8_ = 0;
          auVar19._0_8_ = uVar11;
          auVar53 = vpshufd_avx(auVar19,0x44);
          auVar24._16_16_ = auVar53;
          auVar24._0_16_ = auVar53;
          auVar51 = vorps_avx(auVar24,_DAT_0054ed00);
          auVar46 = vorps_avx(auVar24,auVar46);
          auVar38 = vpor_avx(auVar49,auVar13);
          auVar53 = vpcmpgtq_avx(auVar46._16_16_ ^ auVar13,auVar38);
          auVar54 = vpcmpgtq_avx(auVar46._0_16_ ^ auVar13,auVar42);
          auVar53 = vpackssdw_avx(auVar54,auVar53);
          auVar54 = vpcmpgtq_avx(auVar51._16_16_ ^ auVar13,auVar38);
          auVar45._0_8_ = auVar51._0_8_ ^ 0x8000000000000000;
          auVar45._8_4_ = auVar51._8_4_;
          auVar45._12_4_ = auVar51._12_4_ ^ 0x80000000;
          auVar38 = vpcmpgtq_avx(auVar45,auVar52);
          auVar54 = vpackssdw_avx(auVar38,auVar54);
          auVar53 = vpackssdw_avx(auVar54 ^ auVar41,auVar53 ^ auVar41);
          auVar54 = vpmovsxwd_avx(auVar53);
          auVar53 = vpunpckhwd_avx(auVar53,auVar53);
          auVar25._16_16_ = auVar53;
          auVar25._0_16_ = auVar54;
          auVar46 = vmaskmovps_avx(auVar25,*(undefined1 (*) [32])((long)*pauVar10 + uVar11 * 4));
          auVar20._0_8_ = auVar46._0_8_ ^ 0x8000000080000000;
          auVar20._8_4_ = auVar46._8_4_ ^ 0x80000000;
          auVar20._12_4_ = auVar46._12_4_ ^ 0x80000000;
          auVar26._16_4_ = -auVar46._16_4_;
          auVar26._0_16_ = auVar20;
          auVar26._20_4_ = auVar46._20_4_ ^ 0x80000000;
          auVar26._24_4_ = auVar46._24_4_ ^ 0x80000000;
          auVar26._28_4_ = auVar46._28_4_ ^ 0x80000000;
          auVar38 = auVar26._16_16_;
          local_108._0_4_ = expf(auVar26._16_4_);
          local_108._4_4_ = extraout_XMM0_Db;
          local_108._8_4_ = extraout_XMM0_Dc;
          local_108._12_4_ = extraout_XMM0_Dd;
          auVar53 = vpermilps_avx(auVar38,0xf5);
          auVar56._0_4_ = expf(auVar53._0_4_);
          auVar56._4_60_ = extraout_var;
          auVar53 = vinsertps_avx(local_108,auVar56._0_16_,0x10);
          auVar54 = vpermilps_avx(auVar38,0x4e);
          auVar29._0_4_ = expf(auVar54._0_4_);
          auVar29._4_60_ = extraout_var_00;
          auVar53 = vinsertps_avx(auVar53,auVar29._0_16_,0x20);
          auVar54 = vpermilps_avx(auVar38,0xff);
          auVar30._0_4_ = expf(auVar54._0_4_);
          auVar30._4_60_ = extraout_var_01;
          auVar53 = vinsertps_avx(auVar53,auVar30._0_16_,0x30);
          local_b8 = (float)auVar20._0_8_;
          local_108._0_4_ = expf(local_b8);
          local_108._4_4_ = extraout_XMM0_Db_00;
          local_108._8_4_ = extraout_XMM0_Dc_00;
          local_108._12_4_ = extraout_XMM0_Dd_00;
          auVar54 = vpermilps_avx(auVar20,0xf5);
          auVar31._0_4_ = expf(auVar54._0_4_);
          auVar31._4_60_ = extraout_var_02;
          auVar54 = vinsertps_avx(local_108,auVar31._0_16_,0x10);
          auVar38 = vpermilps_avx(auVar20,0x4e);
          auVar32._0_4_ = expf(auVar38._0_4_);
          auVar32._4_60_ = extraout_var_03;
          auVar54 = vinsertps_avx(auVar54,auVar32._0_16_,0x20);
          auVar38 = vpermilps_avx(auVar20,0xff);
          auVar33._0_4_ = expf(auVar38._0_4_);
          auVar46 = _DAT_0054ed20;
          auVar33._4_60_ = extraout_var_04;
          auVar41 = vpcmpeqd_avx(auVar41,auVar41);
          auVar55._8_4_ = 0x3f800000;
          auVar55._0_8_ = 0x3f8000003f800000;
          auVar55._12_4_ = 0x3f800000;
          auVar55._16_4_ = 0x3f800000;
          auVar55._20_4_ = 0x3f800000;
          auVar55._24_4_ = 0x3f800000;
          auVar55._28_4_ = 0x3f800000;
          auVar56 = ZEXT3264(auVar55);
          auVar54 = vinsertps_avx(auVar54,auVar33._0_16_,0x30);
          auVar27._0_4_ = auVar54._0_4_ + 1.0;
          auVar27._4_4_ = auVar54._4_4_ + 1.0;
          auVar27._8_4_ = auVar54._8_4_ + 1.0;
          auVar27._12_4_ = auVar54._12_4_ + 1.0;
          auVar27._16_4_ = auVar53._0_4_ + 1.0;
          auVar27._20_4_ = auVar53._4_4_ + 1.0;
          auVar27._24_4_ = auVar53._8_4_ + 1.0;
          auVar27._28_4_ = auVar53._12_4_ + 1.0;
          auVar51 = vrcpps_avx(auVar27);
          fVar12 = auVar51._0_4_;
          fVar34 = auVar51._4_4_;
          auVar3._4_4_ = auVar27._4_4_ * fVar34;
          auVar3._0_4_ = auVar27._0_4_ * fVar12;
          fVar35 = auVar51._8_4_;
          auVar3._8_4_ = auVar27._8_4_ * fVar35;
          fVar36 = auVar51._12_4_;
          auVar3._12_4_ = auVar27._12_4_ * fVar36;
          fVar37 = auVar51._16_4_;
          auVar3._16_4_ = auVar27._16_4_ * fVar37;
          fVar39 = auVar51._20_4_;
          auVar3._20_4_ = auVar27._20_4_ * fVar39;
          fVar40 = auVar51._24_4_;
          auVar3._24_4_ = auVar27._24_4_ * fVar40;
          auVar3._28_4_ = auVar27._28_4_;
          auVar21 = vsubps_avx(auVar55,auVar3);
          auVar28._0_4_ = fVar12 + fVar12 * auVar21._0_4_;
          auVar28._4_4_ = fVar34 + fVar34 * auVar21._4_4_;
          auVar28._8_4_ = fVar35 + fVar35 * auVar21._8_4_;
          auVar28._12_4_ = fVar36 + fVar36 * auVar21._12_4_;
          auVar28._16_4_ = fVar37 + fVar37 * auVar21._16_4_;
          auVar28._20_4_ = fVar39 + fVar39 * auVar21._20_4_;
          auVar28._24_4_ = fVar40 + fVar40 * auVar21._24_4_;
          auVar28._28_4_ = auVar51._28_4_ + auVar21._28_4_;
          auVar51 = vmaskmovps_avx(auVar25,auVar28);
          *(undefined1 (*) [32])((long)*pauVar10 + uVar11 * 4) = auVar51;
          uVar11 = uVar11 + 8;
        } while ((uVar6 + 8 & 0xfffffffffffffff8) != uVar11);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar1);
  }
  return 0;
}

Assistant:

int Sigmoid_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_one_avx512, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_one_avx, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_one, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}